

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void multithreadthroughputtest(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ostream *poVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  rep rVar8;
  __int_type _Var9;
  duration<long,_std::ratio<1L,_1000L>_> local_330;
  duration<long,_std::ratio<1L,_1000L>_> local_328;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_320;
  duration<long,_std::ratio<1L,_1000000000L>_> local_318;
  duration<long,_std::ratio<1L,_1000L>_> local_310;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_308;
  allocator<char> local_2c1;
  string local_2c0 [36];
  ushort local_29c;
  allocator<char> local_299;
  string local_298 [32];
  anon_class_8_1_8e111200 local_278;
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::WSMessage_&)>
  local_270;
  anon_class_8_1_8e111200 local_250;
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_248;
  anon_class_32_4_2b349330 local_228;
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&)>
  local_208;
  shared_ptr<SL::WS_LITE::IWSContext_Configuration> local_1e8;
  shared_ptr<SL::WS_LITE::IWSClient_Configuration> local_1d8;
  shared_ptr<SL::WS_LITE::IWSClient_Configuration> local_1c8;
  shared_ptr<SL::WS_LITE::IWSClient_Configuration> local_1b8;
  shared_ptr<SL::WS_LITE::IWSClient_Configuration> local_1a8;
  undefined1 local_198 [8];
  shared_ptr<SL::WS_LITE::IWSHub> c;
  size_t i;
  time_point sendtimer;
  undefined1 local_170 [8];
  shared_ptr<SL::WS_LITE::ITLS_Configuration> clientctx;
  atomic<unsigned_long_long> mbssent;
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::WSMessage_&)>
  local_138;
  anon_class_8_1_8e111200 local_118;
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_110;
  anon_class_8_1_8e111200 local_f0;
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&)>
  local_e8;
  ushort local_c4;
  ThreadCount local_c2;
  shared_ptr<SL::WS_LITE::ITLS_Configuration> local_c0;
  shared_ptr<SL::WS_LITE::IWSContext_Configuration> local_b0;
  shared_ptr<SL::WS_LITE::IWSListener_Configuration> local_a0;
  shared_ptr<SL::WS_LITE::IWSListener_Configuration> local_90;
  shared_ptr<SL::WS_LITE::IWSListener_Configuration> local_80;
  shared_ptr<SL::WS_LITE::IWSListener_Configuration> local_70;
  undefined1 local_60 [8];
  shared_ptr<SL::WS_LITE::IWSHub> listenerctx;
  PortNumber port;
  atomic<unsigned_long_long> mbsreceived;
  time_point lastheard;
  time_point recvtimer;
  undefined1 local_20 [8];
  vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
  clients;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting Multi threaded throughput test");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
  ::vector((vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
            *)local_20);
  std::
  vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
  ::reserve((vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
             *)local_20,0x32);
  std::chrono::_V2::system_clock::now();
  mbsreceived.super___atomic_base<unsigned_long_long>._M_i =
       (__atomic_base<unsigned_long_long>)std::chrono::_V2::system_clock::now();
  std::__atomic_base<unsigned_long_long>::operator=
            ((__atomic_base<unsigned_long_long> *)&stack0xffffffffffffffb8,0);
  SL::WS_LITE::Explicit<unsigned_short,_SL::WS_LITE::INTERNAL::PorNumbertTag>::Explicit
            ((Explicit<unsigned_short,_SL::WS_LITE::INTERNAL::PorNumbertTag> *)
             ((long)&listenerctx.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 6),0xbbc);
  SL::WS_LITE::Explicit<unsigned_short,_SL::WS_LITE::INTERNAL::ThreadCountTag>::Explicit
            (&local_c2,2);
  SL::WS_LITE::CreateContext((WS_LITE *)&local_c0,local_c2);
  peVar3 = std::
           __shared_ptr_access<SL::WS_LITE::ITLS_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::ITLS_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_c0);
  (*peVar3->_vptr_ITLS_Configuration[3])(&local_b0);
  peVar4 = std::
           __shared_ptr_access<SL::WS_LITE::IWSContext_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::IWSContext_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_b0);
  local_c4 = listenerctx.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._6_2_;
  (*peVar4->_vptr_IWSContext_Configuration[2])
            (&local_a0,peVar4,
             (ulong)listenerctx.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._6_2_,0);
  peVar5 = std::
           __shared_ptr_access<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_a0);
  local_f0.lastheard = (time_point *)&mbsreceived;
  std::function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,SL::WS_LITE::HttpHeader_const&)>
  ::function<multithreadthroughputtest()::__0,void>
            ((function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,SL::WS_LITE::HttpHeader_const&)>
              *)&local_e8,&local_f0);
  (*peVar5->_vptr_IWSListener_Configuration[2])(&local_90,peVar5,&local_e8);
  peVar5 = std::
           __shared_ptr_access<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_90);
  local_118.lastheard = (time_point *)&mbsreceived;
  std::
  function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,unsigned_short,std::__cxx11::string_const&)>
  ::function<multithreadthroughputtest()::__1,void>
            ((function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,unsigned_short,std::__cxx11::string_const&)>
              *)&local_110,&local_118);
  (*peVar5->_vptr_IWSListener_Configuration[4])(&local_80,peVar5,&local_110);
  peVar5 = std::
           __shared_ptr_access<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_80);
  mbssent.super___atomic_base<unsigned_long_long>._M_i =
       (__atomic_base<unsigned_long_long>)&mbsreceived;
  std::function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,SL::WS_LITE::WSMessage_const&)>
  ::function<multithreadthroughputtest()::__2,void>
            ((function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,SL::WS_LITE::WSMessage_const&)>
              *)&local_138,(anon_class_32_4_620775c7 *)&mbssent);
  (*peVar5->_vptr_IWSListener_Configuration[3])(&local_70,peVar5,&local_138);
  peVar5 = std::
           __shared_ptr_access<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_70);
  (*peVar5->_vptr_IWSListener_Configuration[7])(local_60,peVar5,1);
  std::shared_ptr<SL::WS_LITE::IWSListener_Configuration>::~shared_ptr(&local_70);
  std::
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::WSMessage_&)>
  ::~function(&local_138);
  std::shared_ptr<SL::WS_LITE::IWSListener_Configuration>::~shared_ptr(&local_80);
  std::
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_110);
  std::shared_ptr<SL::WS_LITE::IWSListener_Configuration>::~shared_ptr(&local_90);
  std::
  function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&)>
  ::~function(&local_e8);
  std::shared_ptr<SL::WS_LITE::IWSListener_Configuration>::~shared_ptr(&local_a0);
  std::shared_ptr<SL::WS_LITE::IWSContext_Configuration>::~shared_ptr(&local_b0);
  std::shared_ptr<SL::WS_LITE::ITLS_Configuration>::~shared_ptr(&local_c0);
  std::__atomic_base<unsigned_long_long>::operator=
            ((__atomic_base<unsigned_long_long> *)
             &clientctx.
              super___shared_ptr<SL::WS_LITE::ITLS_Configuration,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,0);
  SL::WS_LITE::Explicit<unsigned_short,_SL::WS_LITE::INTERNAL::ThreadCountTag>::Explicit
            ((Explicit<unsigned_short,_SL::WS_LITE::INTERNAL::ThreadCountTag> *)
             ((long)&sendtimer.__d.__r + 6),2);
  SL::WS_LITE::CreateContext((WS_LITE *)local_170,sendtimer.__d.__r._6_2_);
  i = std::chrono::_V2::system_clock::now();
  for (c.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var1._M_pi = c.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi,
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::
               vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
               ::capacity((vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
                           *)local_20), _Var1._M_pi < p_Var6;
      c.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(c.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
    peVar3 = std::
             __shared_ptr_access<SL::WS_LITE::ITLS_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::ITLS_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_170);
    (*peVar3->_vptr_ITLS_Configuration[3])(&local_1e8);
    peVar4 = std::
             __shared_ptr_access<SL::WS_LITE::IWSContext_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::IWSContext_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_1e8);
    (*peVar4->_vptr_IWSContext_Configuration[3])(&local_1d8,peVar4,0);
    peVar7 = std::
             __shared_ptr_access<SL::WS_LITE::IWSClient_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::IWSClient_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_1d8);
    local_228.clients =
         (vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
          *)local_20;
    local_228.lastheard = (time_point *)&mbsreceived;
    local_228.mbssent =
         (atomic<unsigned_long_long> *)
         &clientctx.super___shared_ptr<SL::WS_LITE::ITLS_Configuration,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
    local_228.sendtimer = (time_point *)&i;
    std::
    function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,SL::WS_LITE::HttpHeader_const&)>::
    function<multithreadthroughputtest()::__3,void>
              ((function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,SL::WS_LITE::HttpHeader_const&)>
                *)&local_208,&local_228);
    (*peVar7->_vptr_IWSClient_Configuration[2])(&local_1c8,peVar7,&local_208);
    peVar7 = std::
             __shared_ptr_access<SL::WS_LITE::IWSClient_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::IWSClient_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_1c8);
    local_250.lastheard = (time_point *)&mbsreceived;
    std::
    function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,unsigned_short,std::__cxx11::string_const&)>
    ::function<multithreadthroughputtest()::__4,void>
              ((function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,unsigned_short,std::__cxx11::string_const&)>
                *)&local_248,&local_250);
    (*peVar7->_vptr_IWSClient_Configuration[4])(&local_1b8,peVar7,&local_248);
    peVar7 = std::
             __shared_ptr_access<SL::WS_LITE::IWSClient_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::IWSClient_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_1b8);
    local_278.lastheard = (time_point *)&mbsreceived;
    std::
    function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,SL::WS_LITE::WSMessage_const&)>::
    function<multithreadthroughputtest()::__5,void>
              ((function<void(std::shared_ptr<SL::WS_LITE::IWebSocket>const&,SL::WS_LITE::WSMessage_const&)>
                *)&local_270,&local_278);
    (*peVar7->_vptr_IWSClient_Configuration[3])(&local_1a8,peVar7,&local_270);
    peVar7 = std::
             __shared_ptr_access<SL::WS_LITE::IWSClient_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<SL::WS_LITE::IWSClient_Configuration,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_298,"localhost",&local_299);
    local_29c = listenerctx.super___shared_ptr<SL::WS_LITE::IWSHub,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._6_2_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2c0,"/",&local_2c1);
    local_308._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_308._M_h._M_rehash_policy._4_4_ = 0;
    local_308._M_h._M_rehash_policy._M_next_resize = 0;
    local_308._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_308._M_h._M_element_count = 0;
    local_308._M_h._M_buckets = (__buckets_ptr)0x0;
    local_308._M_h._M_bucket_count = 0;
    local_308._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::unordered_map(&local_308);
    (*peVar7->_vptr_IWSClient_Configuration[7])
              (local_198,peVar7,local_298,(ulong)local_29c,1,local_2c0,&local_308);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~unordered_map(&local_308);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator(&local_299);
    std::shared_ptr<SL::WS_LITE::IWSClient_Configuration>::~shared_ptr(&local_1a8);
    std::
    function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::WSMessage_&)>
    ::~function(&local_270);
    std::shared_ptr<SL::WS_LITE::IWSClient_Configuration>::~shared_ptr(&local_1b8);
    std::
    function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_248);
    std::shared_ptr<SL::WS_LITE::IWSClient_Configuration>::~shared_ptr(&local_1c8);
    std::
    function<void_(const_std::shared_ptr<SL::WS_LITE::IWebSocket>_&,_const_SL::WS_LITE::HttpHeader_&)>
    ::~function(&local_208);
    std::shared_ptr<SL::WS_LITE::IWSClient_Configuration>::~shared_ptr(&local_1d8);
    std::shared_ptr<SL::WS_LITE::IWSContext_Configuration>::~shared_ptr(&local_1e8);
    std::
    vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
    ::push_back((vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
                 *)local_20,(value_type *)local_198);
    std::shared_ptr<SL::WS_LITE::IWSHub>::~shared_ptr((shared_ptr<SL::WS_LITE::IWSHub> *)local_198);
  }
  while( true ) {
    local_320.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_318.__r =
         (rep)std::chrono::operator-
                        (&local_320,
                         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)&mbsreceived);
    local_310.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_318);
    rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_310);
    if (4999 < rVar8) break;
    local_328.__r = (rep)ms<(char)50,(char)48,(char)48>();
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_328);
  }
  local_330.__r = (rep)ms<(char)50,(char)48,(char)48>();
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_330);
  poVar2 = std::operator<<((ostream *)&std::cout,"Received ");
  _Var9 = std::__atomic_base::operator_cast_to_unsigned_long_long
                    ((__atomic_base *)&stack0xffffffffffffffb8);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_Var9);
  poVar2 = std::operator<<(poVar2,"  bytes");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<SL::WS_LITE::ITLS_Configuration>::~shared_ptr
            ((shared_ptr<SL::WS_LITE::ITLS_Configuration> *)local_170);
  std::shared_ptr<SL::WS_LITE::IWSHub>::~shared_ptr((shared_ptr<SL::WS_LITE::IWSHub> *)local_60);
  std::
  vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
  ::~vector((vector<std::shared_ptr<SL::WS_LITE::IWSHub>,_std::allocator<std::shared_ptr<SL::WS_LITE::IWSHub>_>_>
             *)local_20);
  return;
}

Assistant:

void multithreadthroughputtest()
{
    std::cout << "Starting Multi threaded throughput test" << std::endl;
    std::vector<std::shared_ptr<SL::WS_LITE::IWSHub>> clients;
    clients.reserve(50); // this should use about 1 GB of memory between sending and receiving
    auto recvtimer = std::chrono::high_resolution_clock::now();
    auto lastheard = std::chrono::high_resolution_clock::now();
    std::atomic<unsigned long long> mbsreceived;
    mbsreceived = 0;

    SL::WS_LITE::PortNumber port(3004);
    auto listenerctx =
        SL::WS_LITE::CreateContext(SL::WS_LITE::ThreadCount(2))
            ->NoTLS()
            ->CreateListener(port)
            ->onConnection([&](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket, const SL::WS_LITE::HttpHeader &header) {
                lastheard = std::chrono::high_resolution_clock::now();
            })
            ->onDisconnection([&](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket, unsigned short code, const std::string &msg) {
                lastheard = std::chrono::high_resolution_clock::now();
            })
            ->onMessage([&](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket, const SL::WS_LITE::WSMessage &message) {
                lastheard = std::chrono::high_resolution_clock::now();
                mbsreceived += message.len;
                if (mbsreceived == bufferesize * clients.capacity()) {
                    std::cout << "Took "
                              << std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::high_resolution_clock::now() - recvtimer).count()
                              << "ms to receive " << bufferesize * clients.capacity() << " bytes" << std::endl;
                }
            })
            ->listen();

    std::atomic<unsigned long long> mbssent;
    mbssent = 0;

    auto clientctx = SL::WS_LITE::CreateContext(SL::WS_LITE::ThreadCount(2));
    auto sendtimer = std::chrono::high_resolution_clock::now();
    for (size_t i = 0; i < clients.capacity(); i++) {
        auto c =
            clientctx->NoTLS()
                ->CreateClient()
                ->onConnection([&clients, &lastheard, &mbssent, &sendtimer](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket,
                                                                            const SL::WS_LITE::HttpHeader &header) {
                    lastheard = std::chrono::high_resolution_clock::now();
                    SL::WS_LITE::WSMessage msg;
                    msg.Buffer = std::shared_ptr<unsigned char>(new unsigned char[bufferesize], [&](unsigned char *p) {
                        mbssent += bufferesize;
                        if (mbssent == bufferesize * clients.capacity()) {
                            std::cout << "Took "
                                      << std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::high_resolution_clock::now() - sendtimer)
                                             .count()
                                      << "ms to send " << bufferesize * clients.capacity() << " bytes" << std::endl;
                        }
                        delete[] p;
                    });
                    msg.len = bufferesize; // 10MB
                    msg.code = SL::WS_LITE::OpCode::BINARY;
                    msg.data = msg.Buffer.get();
                    socket->send(msg, SL::WS_LITE::CompressionOptions::NO_COMPRESSION);
                })
                ->onDisconnection([&](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket, unsigned short code, const std::string &msg) {
                    lastheard = std::chrono::high_resolution_clock::now();
                })
                ->onMessage([&](const std::shared_ptr<SL::WS_LITE::IWebSocket> &socket, const SL::WS_LITE::WSMessage &message) {
                    lastheard = std::chrono::high_resolution_clock::now();
                })
                ->connect("localhost", port);
        clients.push_back(c);
    }
    while (std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::high_resolution_clock::now() - lastheard).count() < 5000) {
        std::this_thread::sleep_for(200ms);
    }
    std::this_thread::sleep_for(200ms);
    std::cout << "Received " << mbsreceived << "  bytes" << std::endl;
}